

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSAttribute.cpp
# Opt level: O1

void __thiscall OSAttribute::OSAttribute(OSAttribute *this,OSAttribute *in)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_OSAttribute = (_func_int **)&PTR__OSAttribute_00151db8;
  ByteString::ByteString(&this->byteStrValue);
  p_Var1 = &(this->mechSetValue)._M_t._M_impl.super__Rb_tree_header;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->attrMapValue)._M_t._M_impl.super__Rb_tree_header;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->attributeType = in->attributeType;
  this->boolValue = in->boolValue;
  this->ulongValue = in->ulongValue;
  ByteString::operator=(&this->byteStrValue,&in->byteStrValue);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::operator=(&(this->mechSetValue)._M_t,&(in->mechSetValue)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  ::operator=(&(this->attrMapValue)._M_t,&(in->attrMapValue)._M_t);
  return;
}

Assistant:

OSAttribute::OSAttribute(const OSAttribute& in)
{
	attributeType = in.attributeType;
	boolValue = in.boolValue;
	ulongValue = in.ulongValue;
	byteStrValue = in.byteStrValue;
	mechSetValue = in.mechSetValue;
	attrMapValue = in.attrMapValue;
}